

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

string * __thiscall embree::FileName::base_abi_cxx11_(string *__return_storage_ptr__,FileName *this)

{
  pointer pcVar1;
  long lVar2;
  
  lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->filename)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->filename)._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileName::base() const {
    size_t pos = filename.find_last_of(path_sep);
    if (pos == std::string::npos) return filename;
    return filename.substr(pos+1);
  }